

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int main(void)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  test_state state;
  aec_stream strm;
  int status;
  test_state *in_stack_ffffffffffffff48;
  int local_8;
  int local_4;
  
  __ptr = malloc(0xc00);
  __ptr_00 = malloc(0x1800);
  __ptr_01 = malloc(0xc00);
  if (((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) || (__ptr_01 == (void *)0x0)) {
    printf("Not enough memory.\n");
    local_4 = 99;
  }
  else {
    printf("***************************\n");
    printf("Checking with small buffers\n");
    printf("***************************\n");
    local_8 = check_byte_orderings(in_stack_ffffffffffffff48);
    if (local_8 == 0) {
      printf("***************************\n");
      printf("Checking with large buffers\n");
      printf("***************************\n");
      local_8 = check_byte_orderings(in_stack_ffffffffffffff48);
    }
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    local_4 = local_8;
  }
  return local_4;
}

Assistant:

int main (void)
{
    int status;
    struct aec_stream strm;
    struct test_state state;

    state.buf_len = state.ibuf_len = BUF_SIZE;
    state.cbuf_len = 2 * BUF_SIZE;

    state.ubuf = (unsigned char *)malloc(state.buf_len);
    state.cbuf = (unsigned char *)malloc(state.cbuf_len);
    state.obuf = (unsigned char *)malloc(state.buf_len);

    if (!state.ubuf || !state.cbuf || !state.obuf) {
        printf("Not enough memory.\n");
        return 99;
    }

    strm.flags = 0;
    state.strm = &strm;

    printf("***************************\n");
    printf("Checking with small buffers\n");
    printf("***************************\n");
    state.codec = encode_decode_small;
    status = check_byte_orderings(&state);
    if (status)
        goto DESTRUCT;

    printf("***************************\n");
    printf("Checking with large buffers\n");
    printf("***************************\n");
    state.codec = encode_decode_large;
    status = check_byte_orderings(&state);

DESTRUCT:
    free(state.ubuf);
    free(state.cbuf);
    free(state.obuf);

    return status;
}